

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O1

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction
          (LoopUnrollerUtilsImpl *this,BasicBlock *insert_point)

{
  Function *pFVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_00;
  Instruction *this_01;
  Function *pFVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long lVar7;
  pointer puVar8;
  long lVar9;
  bool bVar10;
  
  pFVar1 = this->function_;
  puVar2 = (pFVar1->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar10 = puVar2 == (pFVar1->blocks_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar10) {
    lVar7 = -(long)puVar2;
    do {
      puVar8 = puVar2 + 1;
      this_00.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (((puVar2->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ;
      uVar6 = 0;
      uVar5 = 0;
      if (*(bool *)((long)this_00.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x2d) == true) {
        uVar5 = Instruction::GetSingleWordOperand
                          ((Instruction *)
                           this_00.
                           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                           (uint)*(bool *)((long)this_00.
                                                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                 .
                                                 super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                 ._M_head_impl + 0x2c));
      }
      this_01 = (insert_point->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (this_01->has_result_id_ == true) {
        uVar6 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
      }
      if (uVar5 == uVar6) {
        puVar2 = (pFVar1->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)(pFVar1->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::resize(&pFVar1->blocks_,
                 ((long)(this->blocks_to_add_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->blocks_to_add_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + (lVar9 >> 3));
        puVar8 = (pFVar1->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*>
                  ((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)((long)puVar8 + (-lVar7 - (long)puVar2)),
                   (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)(lVar9 + (long)puVar8),
                   (pFVar1->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__copy_move<true,false,std::random_access_iterator_tag>::
        __copy_m<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*>
                  ((this->blocks_to_add_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this->blocks_to_add_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)((long)(pFVar1->blocks_).
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (-lVar7 - (long)puVar2)));
        if (!bVar10) {
          return;
        }
        break;
      }
      pFVar3 = this->function_;
      lVar7 = lVar7 + -8;
      bVar4 = (pFVar3->blocks_).
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == puVar8;
      bVar10 = bVar4 && pFVar1 == pFVar3;
      puVar2 = puVar8;
    } while (!bVar4 || pFVar1 != pFVar3);
  }
  __assert_fail("false && \"Could not add basic blocks to function as insert point was not found.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp"
                ,0x358,
                "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::AddBlocksToFunction(const BasicBlock *)"
               );
}

Assistant:

void LoopUnrollerUtilsImpl::AddBlocksToFunction(
    const BasicBlock* insert_point) {
  for (auto basic_block_iterator = function_.begin();
       basic_block_iterator != function_.end(); ++basic_block_iterator) {
    if (basic_block_iterator->id() == insert_point->id()) {
      basic_block_iterator.InsertBefore(&blocks_to_add_);
      return;
    }
  }

  assert(
      false &&
      "Could not add basic blocks to function as insert point was not found.");
}